

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

void __thiscall OpenMD::SimInfo::calcNConstraints(SimInfo *this)

{
  SimInfo *this_local;
  
  this->nGlobalConstraints_ = this->nConstraints_;
  return;
}

Assistant:

void SimInfo::calcNConstraints() {
#ifdef IS_MPI
    MPI_Allreduce(&nConstraints_, &nGlobalConstraints_, 1, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);
#else
    nGlobalConstraints_     = nConstraints_;
#endif
  }